

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

bool __thiscall duckdb::FlushMoveState::Scan(FlushMoveState *this)

{
  TupleDataCollection *this_00;
  idx_t scan_count;
  column_t column_id;
  bool bVar1;
  SelectionVector *scan_sel;
  SelectionVector *target_sel;
  
  bVar1 = TupleDataCollection::Scan(this->collection,&this->scan_state,&this->groups);
  this_00 = this->collection;
  if (bVar1) {
    scan_sel = FlatVector::IncrementalSelectionVector();
    scan_count = (this->groups).count;
    column_id = this->hash_col_idx;
    target_sel = FlatVector::IncrementalSelectionVector();
    TupleDataCollection::Gather
              (this_00,&(this->scan_state).chunk_state.row_locations,scan_sel,scan_count,column_id,
               &this->hashes,target_sel,(optional_ptr<duckdb::Vector,_true>)0x0);
  }
  else {
    TupleDataCollection::FinalizePinState(this_00,&(this->scan_state).pin_state);
  }
  return bVar1;
}

Assistant:

bool Scan() {
		if (collection.Scan(scan_state, groups)) {
			collection.Gather(scan_state.chunk_state.row_locations, *FlatVector::IncrementalSelectionVector(),
			                  groups.size(), hash_col_idx, hashes, *FlatVector::IncrementalSelectionVector(), nullptr);
			return true;
		}

		collection.FinalizePinState(scan_state.pin_state);
		return false;
	}